

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::attWildCardIntersection
          (TraverseSchema *this,SchemaAttDef *resultWildCard,SchemaAttDef *compareWildCard)

{
  AttTypes AVar1;
  AttTypes AVar2;
  uint uVar3;
  uint uVar4;
  XMLSize_t XVar5;
  ValueVectorOf<unsigned_int> *this_00;
  ulong uVar6;
  QName *pQVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  int iVar13;
  undefined4 extraout_var;
  uint *puVar14;
  undefined4 extraout_var_00;
  ValueVectorOf<unsigned_int> *pVVar15;
  XMLSize_t i;
  XMLSize_t XVar16;
  ulong uVar17;
  SchemaAttDef *pSVar18;
  SchemaAttDef *pSVar19;
  XMLSize_t i_1;
  ValueVectorOf<unsigned_int> local_68;
  uint local_3c;
  SchemaAttDef *local_38;
  
  AVar1 = (resultWildCard->super_XMLAttDef).fType;
  AVar2 = (compareWildCard->super_XMLAttDef).fType;
  if (AVar1 != AttTypes_Unknown && AVar2 != Any_Any) {
    if (AVar1 == Any_Any || AVar2 == AttTypes_Unknown) {
      pVVar15 = resultWildCard->fNamespaceList;
      if ((pVVar15 != (ValueVectorOf<unsigned_int> *)0x0) && (pVVar15->fCurCount != 0)) {
        pVVar15->fCurCount = 0;
      }
      resultWildCard->fAttName->fURIId = compareWildCard->fAttName->fURIId;
      (resultWildCard->super_XMLAttDef).fType = AVar2;
      (resultWildCard->super_XMLAttDef).fDefaultType =
           (compareWildCard->super_XMLAttDef).fDefaultType;
    }
    else {
      bVar8 = (AVar1 ^ Any_List) != AttTypes_Min;
      bVar9 = (AVar2 ^ Any_Other) != AttTypes_Min;
      pSVar18 = compareWildCard;
      pSVar19 = resultWildCard;
      if (bVar8 || bVar9) {
        pSVar18 = resultWildCard;
        pSVar19 = compareWildCard;
        if ((AVar1 ^ Any_Other) != AttTypes_Min || (AVar2 ^ Any_List) != AttTypes_Min) {
          if ((AVar1 ^ Any_List) != AttTypes_Min || (AVar2 ^ Any_List) != AttTypes_Min) {
            if ((AVar1 ^ Any_Other) != AttTypes_Min || (AVar2 ^ Any_Other) != AttTypes_Min) {
              return;
            }
            pQVar7 = resultWildCard->fAttName;
            uVar3 = compareWildCard->fAttName->fURIId;
            if (pQVar7->fURIId == uVar3) {
              return;
            }
            uVar4 = this->fEmptyNamespaceURI;
            if (pQVar7->fURIId == uVar4) {
              pQVar7->fURIId = uVar3;
              return;
            }
            if (uVar3 == uVar4) {
              return;
            }
            pQVar7->fURIId = uVar4;
            (resultWildCard->super_XMLAttDef).fType = AttTypes_Unknown;
            return;
          }
          pVVar15 = resultWildCard->fNamespaceList;
          this_00 = compareWildCard->fNamespaceList;
          if ((this_00 == (ValueVectorOf<unsigned_int> *)0x0) ||
             (XVar5 = this_00->fCurCount, XVar5 == 0)) {
            if (pVVar15 == (ValueVectorOf<unsigned_int> *)0x0) {
              return;
            }
            if (pVVar15->fCurCount == 0) {
              return;
            }
            pVVar15->fCurCount = 0;
            return;
          }
          local_68.fMemoryManager = this->fGrammarPoolMemoryManager;
          local_68.fCallDestructor = false;
          local_68.fCurCount = 0;
          local_68.fMaxCount = XVar5;
          iVar13 = (*(local_68.fMemoryManager)->_vptr_MemoryManager[3])();
          local_68.fElemList = (uint *)CONCAT44(extraout_var_00,iVar13);
          XVar16 = 0;
          memset(local_68.fElemList,0,XVar5 * 4);
          do {
            puVar14 = ValueVectorOf<unsigned_int>::elementAt(this_00,XVar16);
            if ((pVVar15 != (ValueVectorOf<unsigned_int> *)0x0) &&
               (uVar6 = pVVar15->fCurCount, uVar6 != 0)) {
              uVar3 = *puVar14;
              if (*pVVar15->fElemList != uVar3) {
                uVar12 = 1;
                do {
                  uVar17 = uVar12;
                  if (uVar6 == uVar17) break;
                  uVar12 = uVar17 + 1;
                } while (pVVar15->fElemList[uVar17] != uVar3);
                if (uVar6 <= uVar17) goto LAB_0032c6e2;
              }
              ValueVectorOf<unsigned_int>::ensureExtraCapacity(&local_68,1);
              local_68.fElemList[local_68.fCurCount] = uVar3;
              local_68.fCurCount = local_68.fCurCount + 1;
            }
LAB_0032c6e2:
            XVar16 = XVar16 + 1;
            if (XVar16 == XVar5) {
              SchemaAttDef::setNamespaceList(resultWildCard,&local_68);
              (*(local_68.fMemoryManager)->_vptr_MemoryManager[4])
                        (local_68.fMemoryManager,local_68.fElemList);
              return;
            }
          } while( true );
        }
      }
      pVVar15 = pSVar19->fNamespaceList;
      if ((pVVar15 != (ValueVectorOf<unsigned_int> *)0x0) &&
         (XVar5 = pVVar15->fCurCount, XVar5 != 0)) {
        local_3c = pSVar18->fAttName->fURIId;
        local_68.fMemoryManager = this->fGrammarPoolMemoryManager;
        local_68.fCallDestructor = false;
        local_68.fCurCount = 0;
        local_68.fMaxCount = XVar5;
        local_38 = compareWildCard;
        iVar13 = (*(local_68.fMemoryManager)->_vptr_MemoryManager[3])();
        local_68.fElemList = (uint *)CONCAT44(extraout_var,iVar13);
        memset(local_68.fElemList,0,XVar5 * 4);
        XVar16 = 0;
        bVar11 = false;
        do {
          puVar14 = ValueVectorOf<unsigned_int>::elementAt(pVVar15,XVar16);
          uVar3 = *puVar14;
          bVar10 = true;
          if ((uVar3 != local_3c) && (uVar3 != this->fEmptyNamespaceURI)) {
            ValueVectorOf<unsigned_int>::ensureExtraCapacity(&local_68,1);
            local_68.fElemList[local_68.fCurCount] = uVar3;
            local_68.fCurCount = local_68.fCurCount + 1;
            bVar10 = bVar11;
          }
          XVar16 = XVar16 + 1;
          bVar11 = bVar10;
        } while (XVar5 != XVar16);
        if (bVar10 || (bVar8 || bVar9)) {
          pVVar15 = resultWildCard->fNamespaceList;
          if (local_68.fCurCount == 0) {
            if ((pVVar15 != (ValueVectorOf<unsigned_int> *)0x0) && (pVVar15->fCurCount != 0)) {
              pVVar15->fCurCount = 0;
            }
          }
          else if (pVVar15 == (ValueVectorOf<unsigned_int> *)0x0) {
            pVVar15 = (ValueVectorOf<unsigned_int> *)
                      XMemory::operator_new(0x28,(resultWildCard->super_XMLAttDef).fMemoryManager);
            ValueVectorOf<unsigned_int>::ValueVectorOf(pVVar15,&local_68);
            resultWildCard->fNamespaceList = pVVar15;
          }
          else {
            ValueVectorOf<unsigned_int>::operator=(pVVar15,&local_68);
          }
        }
        (*(local_68.fMemoryManager)->_vptr_MemoryManager[4])
                  (local_68.fMemoryManager,local_68.fElemList);
        compareWildCard = local_38;
      }
      if (bVar8 || bVar9) {
        resultWildCard->fAttName->fURIId = compareWildCard->fAttName->fURIId;
        AVar1 = (compareWildCard->super_XMLAttDef).fType;
        (resultWildCard->super_XMLAttDef).fDefaultType =
             (compareWildCard->super_XMLAttDef).fDefaultType;
        (resultWildCard->super_XMLAttDef).fType = AVar1;
      }
    }
  }
  return;
}

Assistant:

void
TraverseSchema::attWildCardIntersection(SchemaAttDef* const resultWildCard,
                                        const SchemaAttDef* const compareWildCard) {

    XMLAttDef::AttTypes typeR = resultWildCard->getType();
    XMLAttDef::AttTypes typeC = compareWildCard->getType();

    //If either O1 or O2 is any, then the other must be the value.
    if (typeC == XMLAttDef::Any_Any ||
        typeR == XMLAttDef::AttTypes_Unknown) {
        return;
    }

    if (typeR == XMLAttDef::Any_Any ||
        typeC == XMLAttDef::AttTypes_Unknown) {

        resultWildCard->resetNamespaceList();
        copyWildCardData(compareWildCard, resultWildCard);
        return;
    }

    // If either O1 or O2 is a pair of not and a namespace name and the other
    // is a set, then that set, minus the negated namespace name if it was in
    // is the value
    if ((typeC == XMLAttDef::Any_Other && typeR == XMLAttDef::Any_List) ||
        (typeR == XMLAttDef::Any_Other && typeC == XMLAttDef::Any_List)) {

        unsigned int compareURI = 0;
        ValueVectorOf<unsigned int>* nameURIList = 0;

        if (typeC == XMLAttDef::Any_List) {
            nameURIList = compareWildCard->getNamespaceList();
            compareURI = resultWildCard->getAttName()->getURI();
        }
        else {
            nameURIList = resultWildCard->getNamespaceList();
            compareURI = compareWildCard->getAttName()->getURI();
        }

        XMLSize_t listSize = (nameURIList) ? nameURIList->size() : 0;

        if (listSize) {

            bool                        found = false;
            ValueVectorOf<unsigned int> tmpURIList(listSize, fGrammarPoolMemoryManager);

            for (XMLSize_t i=0; i < listSize; i++) {

                unsigned int nameURI = nameURIList->elementAt(i);

                if (nameURI != compareURI &&
                    nameURI != (unsigned int) fEmptyNamespaceURI) {
                    tmpURIList.addElement(nameURI);
                }
                else {
                    found = true;
                }
            }

            if (found || typeC == XMLAttDef::Any_List) {
                resultWildCard->setNamespaceList(&tmpURIList);
            }
        }

        if (typeC == XMLAttDef::Any_List) {
            copyWildCardData(compareWildCard, resultWildCard);
        }

        return;
    }

    // If both O1 and O2 are sets, then the intersection of those sets must be
    // the value.
    if (typeR == XMLAttDef::Any_List && typeC == XMLAttDef::Any_List) {

        ValueVectorOf<unsigned int>* uriListR = resultWildCard->getNamespaceList();
        ValueVectorOf<unsigned int>* uriListC = compareWildCard->getNamespaceList();
        XMLSize_t listSize = (uriListC) ? uriListC->size() : 0;

        if (listSize) {

            ValueVectorOf<unsigned int> tmpURIList(listSize, fGrammarPoolMemoryManager);

            for (XMLSize_t i=0; i < listSize; i++) {

                unsigned int uriName = uriListC->elementAt(i);

                if (uriListR && uriListR->containsElement(uriName)) {
                    tmpURIList.addElement(uriName);
                }
            }

            resultWildCard->setNamespaceList(&tmpURIList);
        }
        else {
            resultWildCard->resetNamespaceList();
        }

        return;
    }

    // If the two are negations of different namespace names, then:
    //  if one is a negation of absent, then result is negation of namespace
    //  else intersection is not expressible.
    if (typeR == XMLAttDef::Any_Other && typeC == XMLAttDef::Any_Other) {

        QName* qnameR = resultWildCard->getAttName();

        if (qnameR->getURI() != compareWildCard->getAttName()->getURI()) {

            if (qnameR->getURI() == (unsigned int)fEmptyNamespaceURI) {
                qnameR->setURI(compareWildCard->getAttName()->getURI());
            }
            else if (compareWildCard->getAttName()->getURI() != (unsigned int)fEmptyNamespaceURI) {

                qnameR->setURI(fEmptyNamespaceURI);
                resultWildCard->setType(XMLAttDef::AttTypes_Unknown);
            }
        }
    }
}